

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

string * __thiscall pbrt::Token::ToString_abi_cxx11_(Token *this)

{
  undefined8 *in_RSI;
  string *in_RDI;
  FileLoc *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *fmt;
  string_view in_stack_ffffffffffffffd0;
  
  fmt = (char *)*in_RSI;
  toString_abi_cxx11_(in_stack_ffffffffffffffd0);
  StringPrintf<std::__cxx11::string,pbrt::FileLoc_const&>
            (fmt,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

std::string Token::ToString() const {
    return StringPrintf("[ Token token: %s loc: %s ]", toString(token), loc);
}